

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

int __thiscall TiXmlElement::QueryUnsignedAttribute(TiXmlElement *this,char *name,uint *value)

{
  int iVar1;
  undefined8 in_RAX;
  TiXmlAttribute *pTVar2;
  int ival;
  undefined8 uStack_28;
  
  pTVar2 = &(this->attributeSet).sentinel;
  uStack_28 = in_RAX;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &(this->attributeSet).sentinel) {
      pTVar2 = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,name);
  } while (iVar1 != 0);
  if (pTVar2 == (TiXmlAttribute *)0x0) {
    iVar1 = 1;
  }
  else {
    uStack_28 = (ulong)(uint)uStack_28;
    iVar1 = __isoc99_sscanf(((pTVar2->value).rep_)->str,"%d",(long)&uStack_28 + 4);
    iVar1 = (uint)(iVar1 != 1) * 2;
    *value = uStack_28._4_4_;
  }
  return iVar1;
}

Assistant:

int TiXmlElement::QueryUnsignedAttribute( const char* name, unsigned* value ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;

	int ival = 0;
	int result = node->QueryIntValue( &ival );
	*value = (unsigned)ival;
	return result;
}